

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_environment_setBinding
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_environment_t *environmentObject;
  sysbvm_tuple_t binding_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(environment);
  if (_Var1) {
    if (*(long *)(environment + 0x40) == 0) {
      sVar2 = sysbvm_identityDictionary_create(context);
      *(sysbvm_tuple_t *)(environment + 0x40) = sVar2;
    }
    sysbvm_identityDictionary_add(context,*(sysbvm_tuple_t *)(environment + 0x40),binding);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_environment_setBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(!sysbvm_tuple_isNonNullPointer(environment))
        return;

    sysbvm_environment_t *environmentObject = (sysbvm_environment_t*)environment;
    if(!environmentObject->symbolTable)
        environmentObject->symbolTable = sysbvm_identityDictionary_create(context);
    sysbvm_identityDictionary_add(context, environmentObject->symbolTable, binding);
}